

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<char,_std::char_traits<char>_> *stream,uint options,xml_encoding encoding)

{
  xml_document_struct *doc;
  long *plVar1;
  ulong uVar2;
  undefined *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  xml_encoding encoding_00;
  xml_memory_page *result;
  long lVar6;
  long lVar7;
  void *contents;
  undefined8 *puVar8;
  ulong uVar9;
  undefined8 *puVar10;
  xml_parse_status xVar11;
  undefined8 *puVar12;
  void *__dest;
  bool bVar13;
  undefined1 auVar14 [16];
  ulong local_50;
  
  _destroy(this);
  this->_memory[0x18] = '\0';
  this->_memory[0x19] = '\0';
  this->_memory[0x1a] = '\0';
  this->_memory[0x1b] = '\0';
  this->_memory[0x1c] = '\0';
  this->_memory[0x1d] = '\0';
  this->_memory[0x1e] = '\0';
  this->_memory[0x1f] = '\0';
  this->_memory[0x20] = '\0';
  this->_memory[0x21] = '\0';
  this->_memory[0x22] = '\0';
  this->_memory[0x23] = '\0';
  this->_memory[0x24] = '\0';
  this->_memory[0x25] = '\0';
  this->_memory[0x26] = '\0';
  this->_memory[0x27] = '\0';
  this->_memory[8] = '\0';
  this->_memory[9] = '\0';
  this->_memory[10] = '\0';
  this->_memory[0xb] = '\0';
  this->_memory[0xc] = '\0';
  this->_memory[0xd] = '\0';
  this->_memory[0xe] = '\0';
  this->_memory[0xf] = '\0';
  this->_memory[0x10] = '\0';
  this->_memory[0x11] = '\0';
  this->_memory[0x12] = '\0';
  this->_memory[0x13] = '\0';
  this->_memory[0x14] = '\0';
  this->_memory[0x15] = '\0';
  this->_memory[0x16] = '\0';
  this->_memory[0x17] = '\0';
  this->_memory[0x18] = -0x28;
  this->_memory[0x19] = '\x7f';
  this->_memory[0x1a] = '\0';
  this->_memory[0x1b] = '\0';
  this->_memory[0x1c] = '\0';
  this->_memory[0x1d] = '\0';
  this->_memory[0x1e] = '\0';
  this->_memory[0x1f] = '\0';
  doc = (xml_document_struct *)(this->_memory + 0x28);
  this->_memory[0x50] = '\0';
  this->_memory[0x51] = '\0';
  this->_memory[0x52] = '\0';
  this->_memory[0x53] = '\0';
  this->_memory[0x54] = '\0';
  this->_memory[0x55] = '\0';
  this->_memory[0x56] = '\0';
  this->_memory[0x57] = '\0';
  this->_memory[0x58] = '\0';
  this->_memory[0x59] = '\0';
  this->_memory[0x5a] = '\0';
  this->_memory[0x5b] = '\0';
  this->_memory[0x5c] = '\0';
  this->_memory[0x5d] = '\0';
  this->_memory[0x5e] = '\0';
  this->_memory[0x5f] = '\0';
  this->_memory[0x30] = '\0';
  this->_memory[0x31] = '\0';
  this->_memory[0x32] = '\0';
  this->_memory[0x33] = '\0';
  this->_memory[0x34] = '\0';
  this->_memory[0x35] = '\0';
  this->_memory[0x36] = '\0';
  this->_memory[0x37] = '\0';
  this->_memory[0x38] = '\0';
  this->_memory[0x39] = '\0';
  this->_memory[0x3a] = '\0';
  this->_memory[0x3b] = '\0';
  this->_memory[0x3c] = '\0';
  this->_memory[0x3d] = '\0';
  this->_memory[0x3e] = '\0';
  this->_memory[0x3f] = '\0';
  this->_memory[0x40] = '\0';
  this->_memory[0x41] = '\0';
  this->_memory[0x42] = '\0';
  this->_memory[0x43] = '\0';
  this->_memory[0x44] = '\0';
  this->_memory[0x45] = '\0';
  this->_memory[0x46] = '\0';
  this->_memory[0x47] = '\0';
  this->_memory[0x48] = '\0';
  this->_memory[0x49] = '\0';
  this->_memory[0x4a] = '\0';
  this->_memory[0x4b] = '\0';
  this->_memory[0x4c] = '\0';
  this->_memory[0x4d] = '\0';
  this->_memory[0x4e] = '\0';
  this->_memory[0x4f] = '\0';
  this->_memory[0x60] = '\0';
  this->_memory[0x61] = '\0';
  this->_memory[0x62] = '\0';
  this->_memory[99] = '\0';
  this->_memory[100] = '\0';
  this->_memory[0x65] = '\0';
  this->_memory[0x66] = '\0';
  this->_memory[0x67] = '\0';
  this->_memory[0x28] = '\x01';
  this->_memory[0x29] = '(';
  this->_memory[0x2a] = '\0';
  this->_memory[0x2b] = '\0';
  this->_memory[0x2c] = '\0';
  this->_memory[0x2d] = '\0';
  this->_memory[0x2e] = '\0';
  this->_memory[0x2f] = '\0';
  *(char **)(this->_memory + 0x68) = this->_memory;
  this->_memory[0x70] = -0x28;
  this->_memory[0x71] = '\x7f';
  this->_memory[0x72] = '\0';
  this->_memory[0x73] = '\0';
  this->_memory[0x74] = '\0';
  this->_memory[0x75] = '\0';
  this->_memory[0x76] = '\0';
  this->_memory[0x77] = '\0';
  this->_memory[0x78] = '\0';
  this->_memory[0x79] = '\0';
  this->_memory[0x7a] = '\0';
  this->_memory[0x7b] = '\0';
  this->_memory[0x7c] = '\0';
  this->_memory[0x7d] = '\0';
  this->_memory[0x7e] = '\0';
  this->_memory[0x7f] = '\0';
  this->_memory[0x80] = '\0';
  this->_memory[0x81] = '\0';
  this->_memory[0x82] = '\0';
  this->_memory[0x83] = '\0';
  this->_memory[0x84] = '\0';
  this->_memory[0x85] = '\0';
  this->_memory[0x86] = '\0';
  this->_memory[0x87] = '\0';
  (this->super_xml_node)._root = (xml_node_struct *)doc;
  *(xml_document_struct **)(this->_memory + 0x50) = doc;
  *(char **)this->_memory = this->_memory + 0x68;
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_006f7708;
  }
  lVar6 = std::istream::tellg();
  if (lVar6 < 0) {
    puVar10 = (undefined8 *)0x0;
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    uVar5 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    local_50 = 0;
    puVar12 = (undefined8 *)0x0;
    do {
      if ((uVar5 & 2) != 0) {
        contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     (local_50 + 1);
        if (contents != (void *)0x0) {
          puVar12 = puVar10;
          __dest = contents;
          if (puVar10 != (undefined8 *)0x0) goto LAB_006f7628;
          goto LAB_006f769f;
        }
LAB_006f7678:
        xVar11 = status_out_of_memory;
        local_50 = 0;
        contents = (void *)0x0;
        bVar13 = false;
        goto LAB_006f7687;
      }
      puVar8 = (undefined8 *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      if (puVar8 == (undefined8 *)0x0) goto LAB_006f7678;
      *puVar8 = 0;
      puVar8[1] = 0;
      puVar4 = puVar8;
      if (puVar12 != (undefined8 *)0x0) {
        *puVar12 = puVar8;
        puVar4 = puVar10;
      }
      puVar10 = puVar4;
      std::istream::read((char *)stream,(long)(puVar8 + 2));
      uVar2 = *(ulong *)(stream + 8);
      puVar8[1] = uVar2;
      uVar5 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
      contents = (void *)0x0;
      if (((uVar5 & 1) != 0) || ((uVar5 & 6) == 4)) {
        local_50 = 0;
        bVar13 = false;
        xVar11 = status_io_error;
        goto LAB_006f7687;
      }
      uVar9 = uVar2 + local_50;
      if (uVar2 + local_50 <= local_50) {
        uVar9 = local_50;
      }
      bVar13 = CARRY8(uVar2,local_50);
      local_50 = uVar9;
      puVar12 = puVar8;
    } while (!bVar13);
    local_50 = 0;
    contents = (void *)0x0;
    bVar13 = false;
    xVar11 = status_out_of_memory;
    goto LAB_006f7687;
  }
  auVar14 = std::istream::tellg();
  lVar6 = auVar14._0_8_;
  xVar11 = status_io_error;
  std::istream::seekg((long)stream,_S_beg);
  lVar7 = std::istream::tellg();
  std::istream::seekg(stream,lVar6,auVar14._8_8_);
  if (-1 < lVar6 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    xVar11 = status_out_of_memory;
    if ((-1 < lVar7 - lVar6) &&
       (contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     ((lVar7 - lVar6) + 1),
       puVar3 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
       , contents != (void *)0x0)) {
      std::istream::read((char *)stream,(long)contents);
      if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) != 4 &&
          (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) == 0) {
        local_50 = *(ulong *)(stream + 8);
        goto LAB_006f769f;
      }
      (*(code *)puVar3)(contents);
      xVar11 = status_io_error;
    }
  }
  goto LAB_006f76f8;
LAB_006f7628:
  do {
    memcpy(__dest,puVar12 + 2,puVar12[1]);
    plVar1 = puVar12 + 1;
    puVar12 = (undefined8 *)*puVar12;
    __dest = (void *)((long)__dest + *plVar1);
  } while (puVar12 != (undefined8 *)0x0);
  xVar11 = status_ok;
  bVar13 = true;
LAB_006f7687:
  while (puVar10 != (undefined8 *)0x0) {
    puVar12 = (undefined8 *)*puVar10;
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (puVar10);
    puVar10 = puVar12;
  }
  if (bVar13) {
LAB_006f769f:
    encoding_00 = impl::anon_unknown_0::get_buffer_encoding(encoding,contents,local_50);
    if (encoding_00 == encoding_utf8) {
      *(undefined1 *)((long)contents + local_50) = 0;
      local_50 = local_50 + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,local_50,options,
               encoding_00,true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
LAB_006f76f8:
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = xVar11;
LAB_006f7708:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<char>& stream, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding, &_buffer);
	}